

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esni.c
# Opt level: O1

int main(int argc,char **argv)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  int extraout_EAX;
  uint uVar4;
  int iVar5;
  FILE *pFVar6;
  EVP_PKEY *pkey;
  ulong uVar7;
  size_t len;
  ulong uVar8;
  long lVar9;
  ulong extraout_RAX;
  ec_key_st *key;
  EC_GROUP *group;
  long lVar10;
  ptls_cipher_suite_t *ppVar11;
  FILE *unaff_RBX;
  FILE *pFVar12;
  char *pkey_00;
  char *pcVar13;
  FILE *pFVar14;
  ptls_key_exchange_context_t **pppVar15;
  ptls_key_exchange_algorithm_t *algo;
  char **ppcVar16;
  uint64_t _v;
  char *pcVar17;
  bool bVar18;
  uint16_t padded_length;
  ptls_buffer_t buf;
  uint64_t lifetime;
  anon_struct_2056_2_5014a043 key_exchanges;
  ptls_key_exchange_context_t *ctx [256];
  st_x9_62_keyex_context_t *psStack_1910;
  FILE *pFStack_1908;
  char **ppcStack_1900;
  FILE *pFStack_18f8;
  undefined8 uStack_18f0;
  short local_18e2;
  FILE *local_18e0;
  FILE *local_18d8;
  ulong local_18d0;
  undefined1 local_18c8 [38];
  undefined1 local_18a2 [2];
  FILE *local_18a0;
  FILE *local_1898;
  undefined1 local_188e [4];
  undefined1 local_188a [2];
  FILE *local_1888;
  undefined1 local_187c [4];
  undefined1 local_1878 [16];
  FILE local_1868 [9];
  FILE *local_1048;
  ptls_key_exchange_context_t *local_1040 [256];
  long local_840;
  char *local_838 [257];
  
  pFVar12 = (FILE *)(ulong)(uint)argc;
  uStack_18f0 = 0x105cbe;
  OPENSSL_init_crypto(2);
  uStack_18f0 = 0x105cca;
  OPENSSL_init_crypto(0xc);
  uStack_18f0 = 0x105ccf;
  ENGINE_load_builtin_engines();
  uStack_18f0 = 0x105cd4;
  ENGINE_register_all_ciphers();
  uStack_18f0 = 0x105cd9;
  ENGINE_register_all_digests();
  uStack_18f0 = 0x105ced;
  memset(local_1040,0,0x808);
  uStack_18f0 = 0x105d01;
  memset(&local_1868[0]._IO_write_base,0,0x808);
  local_18e2 = 0x104;
  local_18a0 = (FILE *)0x76a700;
  local_18e0 = local_1048;
  local_18d8 = (FILE *)(ptls_openssl_cipher_suites + 1);
  local_1888 = (FILE *)0x0;
  local_1898 = (FILE *)0x0;
LAB_00105d5e:
  uStack_18f0 = 0x105d6b;
  pkey_00 = (char *)argv;
  pFVar6 = pFVar12;
  iVar3 = getopt(argc,argv,"n:K:c:d:p:o:h");
  sVar2 = local_18e2;
  pFVar14 = _optarg;
  ppVar11 = ptls_openssl_cipher_suites[0];
  switch(iVar3) {
  case 99:
    bVar18 = ptls_openssl_cipher_suites[0] == (ptls_cipher_suite_t *)0x0;
    unaff_RBX = (FILE *)ptls_openssl_cipher_suites[0];
    if (bVar18) goto LAB_001065a7;
    uStack_18f0 = 0x105eb7;
    iVar3 = strcasecmp(ptls_openssl_cipher_suites[0]->aead->name,(char *)_optarg);
    unaff_RBX = (FILE *)ppVar11;
    pFVar6 = local_18d8;
    while (iVar3 != 0) {
      unaff_RBX = *(FILE **)pFVar6;
      bVar18 = unaff_RBX == (FILE *)0x0;
      if (bVar18) goto LAB_001065a7;
      uStack_18f0 = 0x105edf;
      iVar3 = strcasecmp(*(char **)unaff_RBX->_IO_read_ptr,(char *)pFVar14);
      pFVar6 = (FILE *)&pFVar6->_IO_read_ptr;
    }
    if (bVar18) goto LAB_001065a7;
    *(FILE **)(local_1868[0]._shortbuf + (long)local_18e0 * 8 + -99) = unaff_RBX;
    local_18e0 = (FILE *)((long)&local_18e0->_flags + 1);
    goto LAB_00105d5e;
  case 100:
    goto switchD_00105d7a_caseD_64;
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
switchD_00105d7a_caseD_65:
    local_1048 = local_18e0;
    uStack_18f0 = 0x1064f1;
    printf("picotls-esni - generates an ESNI Resource Record\n\nUsage: %s [options]\nOptions:\n  -n <published-sni>  published sni value\n  -K <key-file>       private key files (repeat the option to include multiple\n                      keys)\n  -c <cipher-suite>   aes128-gcm, chacha20-poly1305, ...\n  -d <days>           number of days until expiration (default: 90)\n  -p <padded-length>  padded length (default: 260)\n  -o <output-file>    write output to specified file instead of stdout\n                      (use on Windows as stdout is not binary there)\n  -h                  prints this help\n\n-c and -x can be used multiple times.\n\n"
           ,*argv);
    uStack_18f0 = 0x1064fb;
    exit(1);
  case 0x68:
    local_1048 = local_18e0;
    uStack_18f0 = 0x106546;
    printf("picotls-esni - generates an ESNI Resource Record\n\nUsage: %s [options]\nOptions:\n  -n <published-sni>  published sni value\n  -K <key-file>       private key files (repeat the option to include multiple\n                      keys)\n  -c <cipher-suite>   aes128-gcm, chacha20-poly1305, ...\n  -d <days>           number of days until expiration (default: 90)\n  -p <padded-length>  padded length (default: 260)\n  -o <output-file>    write output to specified file instead of stdout\n                      (use on Windows as stdout is not binary there)\n  -h                  prints this help\n\n-c and -x can be used multiple times.\n\n"
           ,*argv);
    uStack_18f0 = 0x10654d;
    exit(0);
  case 0x6e:
    local_1898 = _optarg;
    goto LAB_00105d5e;
  case 0x6f:
    local_1888 = _optarg;
    goto LAB_00105d5e;
  case 0x70:
    break;
  default:
    if (iVar3 == 0x4b) {
      uStack_18f0 = 0x105dd4;
      pFVar6 = fopen((char *)_optarg,"rt");
      if (pFVar6 == (FILE *)0x0) goto LAB_00106583;
      uStack_18f0 = 0x105dee;
      pkey = PEM_read_PrivateKey(pFVar6,(EVP_PKEY **)0x0,(undefined1 *)0x0,(void *)0x0);
      if (pkey == (EVP_PKEY *)0x0) goto LAB_00106595;
      uStack_18f0 = 0x105e02;
      fclose(pFVar6);
      pppVar15 = local_1040 + local_840;
      uStack_18f0 = 0x105e29;
      local_840 = local_840 + 1;
      iVar3 = ptls_openssl_create_key_exchange(pppVar15,(EVP_PKEY *)pkey);
      unaff_RBX = pFVar6;
      if (iVar3 != 0) goto LAB_00106571;
      uStack_18f0 = 0x105e39;
      EVP_PKEY_free(pkey);
      goto LAB_00105d5e;
    }
    if (iVar3 != -1) goto switchD_00105d7a_caseD_65;
    local_1048 = local_18e0;
    if (local_18e0 == (FILE *)0x0) {
      local_1048 = (FILE *)0x1;
      local_1868[0]._IO_write_base = (char *)&ptls_openssl_aes128gcmsha256;
    }
    if (local_840 == 0) {
      uStack_18f0 = 0x1065cd;
      main_cold_9();
      goto LAB_001065cd;
    }
    uStack_18f0 = 0x105f7f;
    uVar7 = time((time_t *)0x0);
    unaff_RBX = local_18a0;
    argv = local_838;
    uStack_18f0 = 0x105f9e;
    memset(argv,0,0x800);
    local_18c8._0_8_ = "";
    local_18c8._8_8_ = (char *)0x0;
    local_18c8._16_8_ = (char *)0x0;
    local_18c8._24_8_ = (ulong)(uint)local_18c8._28_4_ << 0x20;
    pkey_00 = local_188a;
    local_188a = (undefined1  [2])0x2ff;
    uStack_18f0 = 0x105fcf;
    uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18c8,pkey_00,2);
    if (uVar4 != 0) goto LAB_00105ff1;
    pkey_00 = local_187c;
    local_187c = (undefined1  [4])0x0;
    uStack_18f0 = 0x105fed;
    uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18c8,pkey_00,4);
    if (uVar4 != 0) goto LAB_00105ff1;
    local_18e0 = (FILE *)CONCAT62(local_18e0._2_6_,sVar2);
    if (local_1898 == (FILE *)0x0) {
      pkey_00 = local_188e + 2;
      local_188e._2_2_ = 0;
      uStack_18f0 = 0x1060a2;
      uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18c8,pkey_00,2);
      if (uVar4 != 0) goto LAB_00105ff1;
    }
    else {
      pcVar13 = "";
      pFVar6 = (FILE *)local_18c8;
      uStack_18f0 = 0x106078;
      uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)pFVar6,"",2);
      pkey_00 = (char *)local_1898;
      pcVar17 = (char *)local_18c8._16_8_;
      uVar8 = (ulong)uVar4;
      iVar3 = 6;
      if (uVar4 == 0) {
        local_18d8 = unaff_RBX;
        pFVar6 = (FILE *)local_18c8;
        uStack_18f0 = 0x1060cf;
        local_18d0 = uVar7;
        len = strlen((char *)local_1898);
        uStack_18f0 = 0x1060dd;
        uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)pFVar6,pkey_00,len);
        uVar8 = (ulong)uVar4;
        unaff_RBX = local_18d8;
        uVar7 = local_18d0;
        if (uVar4 == 0) {
          uVar8 = local_18c8._16_8_ - (long)pcVar17;
          lVar9 = 8;
          do {
            (((FILE *)(local_18c8._0_8_ + -0xd8))->_unused2 + 0x12)[(long)pcVar17] =
                 (char)(uVar8 >> ((byte)lVar9 & 0x3f));
            lVar9 = lVar9 + -8;
            pcVar17 = pcVar17 + 1;
          } while (lVar9 != -8);
          iVar3 = 0;
          pFVar12 = (FILE *)0x0;
          pkey_00 = (char *)local_18c8._0_8_;
        }
        else {
          pFVar12 = (FILE *)(ulong)uVar4;
        }
      }
      else {
        pFVar12 = (FILE *)(ulong)uVar4;
        pkey_00 = pcVar13;
      }
      if (iVar3 != 0) {
        if (iVar3 != 6) goto LAB_00106038;
        goto LAB_00105ffb;
      }
    }
    pkey_00 = "";
    pFVar6 = (FILE *)local_18c8;
    uStack_18f0 = 0x106148;
    uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)pFVar6,"",2);
    pcVar17 = (char *)local_18c8._16_8_;
    uVar8 = (ulong)uVar4;
    if (uVar4 == 0) {
      local_18d8 = unaff_RBX;
      if (local_1040[0] == (ptls_key_exchange_context_t *)0x0) {
        iVar3 = 0;
        pFVar12 = (FILE *)0x0;
        uVar8 = 0;
      }
      else {
        lVar9 = 0;
        local_18d0 = uVar7;
        do {
          pFVar14 = (FILE *)local_18c8;
          uVar1 = local_1040[0]->algo->id;
          local_18a2 = (undefined1  [2])(uVar1 << 8 | uVar1 >> 8);
          pkey_00 = local_18a2;
          uStack_18f0 = 0x1061a2;
          pFVar6 = pFVar14;
          uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)pFVar14,pkey_00,2);
          uVar8 = (ulong)uVar4;
          if (uVar4 != 0) {
            pFVar12 = (FILE *)(ulong)uVar4;
            iVar3 = 6;
            uVar7 = local_18d0;
            goto LAB_0010625c;
          }
          pkey_00 = "";
          uStack_18f0 = 0x1061be;
          pFVar6 = pFVar14;
          uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)pFVar14,"",2);
          pcVar13 = (char *)local_18c8._16_8_;
          iVar3 = 6;
          if (uVar4 == 0) {
            pkey_00 = (char *)(local_1040[lVar9]->pubkey).base;
            uStack_18f0 = 0x1061eb;
            uVar4 = ptls_buffer__do_pushv
                              ((ptls_buffer_t *)pFVar14,pkey_00,(local_1040[lVar9]->pubkey).len);
            if (uVar4 == 0) {
              uVar7 = local_18c8._16_8_ - (long)pcVar13;
              lVar10 = 8;
              do {
                (((FILE *)(local_18c8._0_8_ + -0xd8))->_unused2 + 0x12)[(long)pcVar13] =
                     (char)(uVar7 >> ((byte)lVar10 & 0x3f));
                lVar10 = lVar10 + -8;
                pcVar13 = pcVar13 + 1;
              } while (lVar10 != -8);
              iVar3 = 0;
              uVar8 = 1;
              pFVar12 = (FILE *)0x0;
              pkey_00 = (char *)local_18c8._0_8_;
            }
            else {
              pFVar12 = (FILE *)(ulong)uVar4;
              uVar8 = 0;
            }
          }
          else {
            pFVar12 = (FILE *)(ulong)uVar4;
            uVar8 = 0;
            pFVar14 = pFVar6;
          }
          pFVar6 = pFVar14;
          uVar7 = local_18d0;
          if ((char)uVar8 == '\0') goto LAB_0010625c;
          local_1040[0] = local_1040[lVar9 + 1];
          lVar9 = lVar9 + 1;
        } while (local_1040[0] != (ptls_key_exchange_context_t *)0x0);
        iVar3 = 0;
        uVar8 = 0;
      }
LAB_0010625c:
      unaff_RBX = local_18d8;
      if (iVar3 == 0) {
        uVar8 = local_18c8._16_8_ - (long)pcVar17;
        lVar9 = 8;
        do {
          (((FILE *)(local_18c8._0_8_ + -0xd8))->_unused2 + 0x12)[(long)pcVar17] =
               (char)(uVar8 >> ((byte)lVar9 & 0x3f));
          lVar9 = lVar9 + -8;
          pcVar17 = pcVar17 + 1;
        } while (lVar9 != -8);
        iVar3 = 0;
        pkey_00 = (char *)local_18c8._0_8_;
      }
    }
    else {
      pFVar12 = (FILE *)(ulong)uVar4;
      iVar3 = 6;
    }
    if (iVar3 == 6) goto LAB_00105ffb;
    if (iVar3 != 0) goto LAB_00106038;
    pkey_00 = "";
    pFVar6 = (FILE *)local_18c8;
    uStack_18f0 = 0x1062bb;
    uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)pFVar6,"",2);
    pcVar17 = (char *)local_18c8._16_8_;
    uVar8 = (ulong)uVar4;
    if (uVar4 == 0) {
      iVar3 = 0;
      local_18d0 = uVar7;
      if ((ptls_cipher_suite_t *)local_1868[0]._IO_write_base == (ptls_cipher_suite_t *)0x0) {
        uVar8 = 1;
        pFVar12 = (FILE *)0x0;
      }
      else {
        ppcVar16 = &local_1868[0]._IO_write_ptr;
        ppVar11 = (ptls_cipher_suite_t *)local_1868[0]._IO_write_base;
        local_18d8 = unaff_RBX;
        do {
          local_18c8._36_2_ = ppVar11->id << 8 | ppVar11->id >> 8;
          pFVar6 = (FILE *)local_18c8;
          uStack_18f0 = 0x106316;
          pkey_00 = (char *)(local_18c8 + 0x24);
          uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)pFVar6,(FILE *)(local_18c8 + 0x24),2);
          pFVar12 = (FILE *)(ulong)uVar4;
          uVar8 = (ulong)(uVar4 == 0);
          unaff_RBX = local_18d8;
          if (uVar4 != 0) {
            iVar3 = 6;
            break;
          }
          ppVar11 = (ptls_cipher_suite_t *)*ppcVar16;
          ppcVar16 = ppcVar16 + 1;
        } while (ppVar11 != (ptls_cipher_suite_t *)0x0);
      }
      uVar7 = local_18d0;
      if ((char)uVar8 != '\0') {
        uVar8 = local_18c8._16_8_ - (long)pcVar17;
        lVar9 = 8;
        do {
          (((FILE *)(local_18c8._0_8_ + -0xd8))->_unused2 + 0x12)[(long)pcVar17] =
               (char)(uVar8 >> ((byte)lVar9 & 0x3f));
          lVar9 = lVar9 + -8;
          pcVar17 = pcVar17 + 1;
        } while (lVar9 != -8);
        iVar3 = 0;
        pkey_00 = (char *)local_18c8._0_8_;
      }
    }
    else {
      pFVar12 = (FILE *)(ulong)uVar4;
      iVar3 = 6;
    }
    if (iVar3 == 6) goto LAB_00105ffb;
    if (iVar3 != 0) goto LAB_00106038;
    local_188e._0_2_ = (ushort)local_18e0 << 8 | (ushort)local_18e0 >> 8;
    pkey_00 = local_188e;
    uStack_18f0 = 0x1063a8;
    uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18c8,pkey_00,2);
    if (uVar4 == 0) {
      local_1878._8_8_ =
           uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
           (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
           (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
      pkey_00 = local_1878 + 8;
      uStack_18f0 = 0x1063cd;
      uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18c8,pkey_00,8);
      if (uVar4 != 0) goto LAB_00105ff1;
      uVar7 = (long)unaff_RBX + (uVar7 - 1);
      local_1878._0_8_ =
           uVar7 >> 0x38 | (uVar7 & 0xff000000000000) >> 0x28 | (uVar7 & 0xff0000000000) >> 0x18 |
           (uVar7 & 0xff00000000) >> 8 | (uVar7 & 0xff000000) << 8 | (uVar7 & 0xff0000) << 0x18 |
           (uVar7 & 0xff00) << 0x28 | uVar7 << 0x38;
      pkey_00 = local_1878;
      uStack_18f0 = 0x1063f6;
      uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)local_18c8,pkey_00,8);
      if (uVar4 != 0) goto LAB_00105ff1;
      pkey_00 = "";
      pFVar6 = (FILE *)local_18c8;
      uStack_18f0 = 0x106414;
      uVar4 = ptls_buffer__do_pushv((ptls_buffer_t *)pFVar6,"",2);
      uVar8 = (ulong)uVar4;
      if (uVar4 == 0) {
        lVar9 = -2;
        do {
          *(char *)(local_18c8._16_8_ + lVar9 + (long)(uint8_t **)local_18c8._0_8_) = '\0';
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0);
        iVar3 = 0;
        pFVar12 = (FILE *)0x0;
        uVar8 = 0;
      }
      else {
        pFVar12 = (FILE *)(ulong)uVar4;
        iVar3 = 6;
      }
      if (iVar3 == 6) goto LAB_00105ffb;
      if (iVar3 != 0) goto LAB_00106038;
      uStack_18f0 = 0x106474;
      ptls_calc_hash(&ptls_openssl_sha256,local_1868,(void *)local_18c8._0_8_,local_18c8._16_8_);
      *(int *)((long)(uint8_t **)local_18c8._0_8_ + 2) = local_1868[0]._flags;
      if (local_1888 != (FILE *)0x0) {
        pkey_00 = "wb";
        uStack_18f0 = 0x106494;
        pFVar6 = local_1888;
        unaff_RBX = fopen((char *)local_1888,"wb");
        pFVar14 = local_1868;
        if (unaff_RBX == (FILE *)0x0) goto LAB_001065b9;
        pkey_00 = (char *)0x1;
        uStack_18f0 = 0x1064b7;
        fwrite((void *)local_18c8._0_8_,1,local_18c8._16_8_,unaff_RBX);
        uStack_18f0 = 0x1064bf;
        pFVar6 = unaff_RBX;
        uVar4 = fclose(unaff_RBX);
        uVar8 = (ulong)uVar4;
        iVar3 = 0;
        goto LAB_001064c1;
      }
      pkey_00 = (char *)0x1;
      uStack_18f0 = 0x106519;
      fwrite((void *)local_18c8._0_8_,1,local_18c8._16_8_,_stdout);
      uStack_18f0 = 0x106521;
      fflush(_stdout);
      goto LAB_00106521;
    }
LAB_00105ff1:
    pFVar12 = (FILE *)(ulong)uVar4;
    goto LAB_00105ffb;
  }
  uStack_18f0 = 0x105e5f;
  iVar3 = __isoc99_sscanf(_optarg,"%hu",&local_18e2);
  if ((iVar3 != 1) || (local_18e2 == 0)) goto LAB_0010655f;
  goto LAB_00105d5e;
switchD_00105d7a_caseD_64:
  uStack_18f0 = 0x105d93;
  iVar3 = __isoc99_sscanf(_optarg,"%lu",&local_18a0);
  if ((iVar3 == 1) && (local_18a0 != (FILE *)0x0)) {
    local_18a0 = (FILE *)((long)local_18a0 * 0x15180);
    goto LAB_00105d5e;
  }
  uStack_18f0 = 0x10655f;
  main_cold_2();
LAB_0010655f:
  uStack_18f0 = 0x106571;
  main_cold_1();
LAB_00106571:
  uStack_18f0 = 0x106583;
  main_cold_4();
LAB_00106583:
  pFVar6 = unaff_RBX;
  uStack_18f0 = 0x106595;
  main_cold_6();
LAB_00106595:
  uStack_18f0 = 0x1065a7;
  main_cold_5();
  unaff_RBX = pFVar6;
LAB_001065a7:
  pkey_00 = (char *)&local_1048;
  uStack_18f0 = 0x1065b9;
  pFVar6 = local_18e0;
  main_cold_3();
  pFVar14 = unaff_RBX;
LAB_001065b9:
  unaff_RBX = pFVar14;
  uStack_18f0 = 0x1065be;
  main_cold_7();
  iVar3 = 6;
  uVar8 = extraout_RAX;
LAB_001064c1:
  if (iVar3 == 0) {
LAB_00106521:
    pFVar12 = (FILE *)0x0;
LAB_00105ffb:
    while (local_838[0] != (char *)0x0) {
      pkey_00 = (char *)0x1;
      uStack_18f0 = 0x106012;
      (**(code **)(local_838[0] + 0x18))(argv,1,0,0,0);
      ppcVar16 = argv + 1;
      argv = argv + 1;
      local_838[0] = *ppcVar16;
    }
    unaff_RBX = (FILE *)local_18c8;
    uStack_18f0 = 0x106029;
    pFVar6 = unaff_RBX;
    ptls_buffer__release_memory((ptls_buffer_t *)unaff_RBX);
    local_18c8._16_8_ = (char *)0x0;
    local_18c8._24_8_ = (char *)0x0;
    local_18c8._0_8_ = (FILE *)0x0;
    local_18c8._8_8_ = (char *)0x0;
    uVar8 = (ulong)((int)pFVar12 == 0);
  }
  else if (iVar3 == 6) goto LAB_00105ffb;
LAB_00106038:
  if ((uVar8 & 1) != 0) {
    return 0;
  }
LAB_001065cd:
  uStack_18f0 = 0x1065d2;
  main_cold_8();
  pFStack_18f8 = (FILE *)0x1065da;
  uStack_18f0._0_4_ = extraout_EAX;
  uVar4 = RAND_bytes((uchar *)pFVar6,(int)pkey_00);
  if (uVar4 == 1) {
    return (int)uStack_18f0;
  }
  pppVar15 = (ptls_key_exchange_context_t **)(ulong)uVar4;
  pFStack_18f8 = (FILE *)ptls_openssl_create_key_exchange;
  ptls_openssl_random_bytes_cold_1();
  pFStack_1908 = unaff_RBX;
  ppcStack_1900 = argv;
  pFStack_18f8 = pFVar12;
  iVar3 = EVP_PKEY_get_id(pkey_00);
  if (iVar3 == 0x40a) {
    iVar3 = evp_keyex_init(&ptls_openssl_x25519,pppVar15,(EVP_PKEY *)pkey_00);
    if (iVar3 != 0) {
      return iVar3;
    }
    EVP_PKEY_up_ref(pkey_00);
  }
  else {
    iVar5 = 0x204;
    if (iVar3 != 0x198) {
      return 0x204;
    }
    key = EVP_PKEY_get1_EC_KEY((EVP_PKEY *)pkey_00);
    group = EC_KEY_get0_group(key);
    iVar3 = EC_GROUP_get_curve_name(group);
    if (iVar3 == 0x19f) {
      algo = &ptls_openssl_secp256r1;
    }
    else if (iVar3 == 0x2cc) {
      algo = &ptls_openssl_secp521r1;
    }
    else {
      if (iVar3 != 0x2cb) goto LAB_001066c9;
      algo = &ptls_openssl_secp384r1;
    }
    psStack_1910 = (st_x9_62_keyex_context_t *)0x0;
    iVar5 = x9_62_create_context(algo,&psStack_1910);
    if (iVar5 == 0) {
      psStack_1910->privkey = (EC_KEY *)key;
      iVar5 = x9_62_setup_pubkey(psStack_1910);
    }
    if (iVar5 == 0) {
      *pppVar15 = &psStack_1910->super;
    }
    else {
      if (psStack_1910 != (st_x9_62_keyex_context_t *)0x0) {
        x9_62_free_context(psStack_1910);
      }
      *pppVar15 = (ptls_key_exchange_context_t *)0x0;
      if (iVar5 != 0) {
LAB_001066c9:
        EC_KEY_free(key);
        return iVar5;
      }
    }
  }
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
    char const *published_sni = NULL;
    char const *file_output = NULL;
    ERR_load_crypto_strings();
    OpenSSL_add_all_algorithms();
#if !defined(OPENSSL_NO_ENGINE)
    /* Load all compiled-in ENGINEs */
    ENGINE_load_builtin_engines();
    ENGINE_register_all_ciphers();
    ENGINE_register_all_digests();
#endif

    struct {
        ptls_key_exchange_context_t *elements[256];
        size_t count;
    } key_exchanges = {{NULL}, 0};
    struct {
        ptls_cipher_suite_t *elements[256];
        size_t count;
    } cipher_suites = {{NULL}, 0};
    uint16_t padded_length = 260;
    uint64_t lifetime = 90 * 86400;

    int ch;

    while ((ch = getopt(argc, argv, "n:K:c:d:p:o:h")) != -1) {
        switch (ch) {
        case 'n':
            published_sni = optarg;
            break;
        case 'K': {
            FILE *fp;
            EVP_PKEY *pkey;

            if ((fp = fopen(optarg, "rt")) == NULL) {
                fprintf(stderr, "failed to open file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }

            if ((pkey = PEM_read_PrivateKey(fp, NULL, NULL, NULL)) == NULL) {
                fprintf(stderr, "failed to read private key from file:%s:%s\n", optarg, strerror(errno));
                exit(1);
            }
            fclose(fp);
            if (ptls_openssl_create_key_exchange(key_exchanges.elements + key_exchanges.count++, pkey) != 0) {
                fprintf(stderr, "unknown type of private key found in file:%s\n", optarg);
                exit(1);
            }
            EVP_PKEY_free(pkey);
        } break;
        case 'c': {
            size_t i;
            for (i = 0; ptls_openssl_cipher_suites[i] != NULL; ++i)
                if (strcasecmp(ptls_openssl_cipher_suites[i]->aead->name, optarg) == 0)
                    break;
            if (ptls_openssl_cipher_suites[i] == NULL) {
                fprintf(stderr, "unknown cipher-suite: %s\n", optarg);
                exit(1);
            }
            cipher_suites.elements[cipher_suites.count++] = ptls_openssl_cipher_suites[i];
        } break;
        case 'd':
            if (sscanf(optarg, "%" SCNu64, &lifetime) != 1 || lifetime == 0) {
                fprintf(stderr, "lifetime must be a positive integer\n");
                exit(1);
            }
            lifetime *= 86400; /* convert to seconds */
            break;
        case 'p':
#ifdef _WINDOWS
            if (sscanf_s(optarg, "%" SCNu16, &padded_length) != 1 || padded_length == 0) {
                fprintf(stderr, "padded length must be a positive integer\n");
                exit(1);
            }
#else
            if (sscanf(optarg, "%" SCNu16, &padded_length) != 1 || padded_length == 0) {
                fprintf(stderr, "padded length must be a positive integer\n");
                exit(1);
            }
#endif
            break;
        case 'o':
            file_output = optarg;
            break;
        case 'h':
            usage(argv[0], 0);
            break;
        default:
            usage(argv[0], 1);
            break;
        }
    }
    if (cipher_suites.count == 0)
        cipher_suites.elements[cipher_suites.count++] = &ptls_openssl_aes128gcmsha256;
    if (key_exchanges.count == 0) {
        fprintf(stderr, "no private key specified\n");
        exit(1);
    }

    argc -= optind;
    argv += optind;

    if (emit_esni(key_exchanges.elements, cipher_suites.elements, padded_length, time(NULL), lifetime, published_sni,
                  file_output) != 0) {
        fprintf(stderr, "failed to generate ESNI private structure.\n");
        exit(1);
    }

    return 0;
}